

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterRegistry.cpp
# Opt level: O2

void Assimp::GetImporterInstanceList
               (vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *out)

{
  OpenGEXImporter *pOVar1;
  OpenGEXImporter *local_20;
  
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::reserve(out,0x40);
  pOVar1 = (OpenGEXImporter *)operator_new(0x90);
  XFileImporter::XFileImporter((XFileImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xb8);
  ObjFileImporter::ObjFileImporter((ObjFileImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xf0);
  AMFImporter::AMFImporter((AMFImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xd8);
  Discreet3DSImporter::Discreet3DSImporter((Discreet3DSImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  M3DImporter::M3DImporter((M3DImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x150);
  MD3Importer::MD3Importer((MD3Importer *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x98);
  MD2Importer::MD2Importer((MD2Importer *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x90);
  PLYImporter::PLYImporter((PLYImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xd0);
  MDLImporter::MDLImporter((MDLImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x98);
  ASEImporter::ASEImporter((ASEImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xd0);
  HMPImporter::HMPImporter((HMPImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x110);
  SMDImporter::SMDImporter((SMDImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x98);
  MDCImporter::MDCImporter((MDCImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(200);
  MD5Importer::MD5Importer((MD5Importer *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xa0);
  STLImporter::STLImporter((STLImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x120);
  LWOImporter::LWOImporter((LWOImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  DXFImporter::DXFImporter((DXFImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  NFFImporter::NFFImporter((NFFImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  RAWImporter::RAWImporter((RAWImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  SIBImporter::SIBImporter((SIBImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  OFFImporter::OFFImporter((OFFImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xa0);
  AC3DImporter::AC3DImporter((AC3DImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xe8);
  BVHLoader::BVHLoader((BVHLoader *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  IRRMeshImporter::IRRMeshImporter((IRRMeshImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x90);
  IRRImporter::IRRImporter((IRRImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  Q3DImporter::Q3DImporter((Q3DImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x168);
  memset(pOVar1,0,0x168);
  B3DImporter::B3DImporter((B3DImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x1a8);
  ColladaLoader::ColladaLoader((ColladaLoader *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  TerragenImporter::TerragenImporter((TerragenImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  CSMImporter::CSMImporter((CSMImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  UnrealImporter::UnrealImporter((UnrealImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xa8);
  LWSImporter::LWSImporter((LWSImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xd0);
  memset(pOVar1,0,0xd0);
  Ogre::OgreImporter::OgreImporter((OgreImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x338);
  OpenGEX::OpenGEXImporter::OpenGEXImporter(pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  MS3DImporter::MS3DImporter((MS3DImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  COBImporter::COBImporter((COBImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  BlenderImporter::BlenderImporter((BlenderImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xd0);
  Q3BSPFileImporter::Q3BSPFileImporter((Q3BSPFileImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  NDOImporter::NDOImporter((NDOImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x88);
  IFCImporter::IFCImporter((IFCImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x90);
  XGLImporter::XGLImporter((XGLImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x88);
  FBXImporter::FBXImporter((FBXImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x80);
  (pOVar1->super_BaseImporter)._vptr_BaseImporter = (_func_int **)0x0;
  *(undefined8 *)&(pOVar1->super_BaseImporter).importerUnits._M_t._M_impl = 0;
  *(undefined8 *)
   &(pOVar1->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pOVar1->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (pOVar1->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (pOVar1->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (pOVar1->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pOVar1->super_BaseImporter).applicationUnits = 0;
  (pOVar1->super_BaseImporter).importerScale = 0.0;
  (pOVar1->super_BaseImporter).fileScale = 0.0;
  (pOVar1->super_BaseImporter).m_ErrorText._M_dataplus._M_p = (pointer)0x0;
  (pOVar1->super_BaseImporter).m_ErrorText._M_string_length = 0;
  (pOVar1->super_BaseImporter).m_ErrorText.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pOVar1->super_BaseImporter).m_ErrorText.field_2 + 8) = 0;
  (pOVar1->super_BaseImporter).m_progress = (ProgressHandler *)0x0;
  pOVar1->m_root = (ChildInfo *)0x0;
  AssbinImporter::AssbinImporter((AssbinImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xb0);
  glTFImporter::glTFImporter((glTFImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xb0);
  glTF2Importer::glTF2Importer((glTF2Importer *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  D3MFImporter::D3MFImporter((D3MFImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xa8);
  X3DImporter::X3DImporter((X3DImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0xb0);
  MMDImporter::MMDImporter((MMDImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  pOVar1 = (OpenGEXImporter *)operator_new(0x78);
  StepFile::StepFileImporter::StepFileImporter((StepFileImporter *)pOVar1);
  local_20 = pOVar1;
  std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>::
  emplace_back<Assimp::BaseImporter*>
            ((vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>> *)out,
             (BaseImporter **)&local_20);
  return;
}

Assistant:

void GetImporterInstanceList(std::vector< BaseImporter* >& out)
{
    // ----------------------------------------------------------------------------
    // Add an instance of each worker class here
    // (register_new_importers_here)
    // ----------------------------------------------------------------------------
    out.reserve(64);
#if (!defined ASSIMP_BUILD_NO_X_IMPORTER)
    out.push_back( new XFileImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OBJ_IMPORTER)
    out.push_back( new ObjFileImporter());
#endif
#ifndef ASSIMP_BUILD_NO_AMF_IMPORTER
	out.push_back( new AMFImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_3DS_IMPORTER)
    out.push_back( new Discreet3DSImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_M3D_IMPORTER)
    out.push_back( new M3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MD3_IMPORTER)
    out.push_back( new MD3Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_MD2_IMPORTER)
    out.push_back( new MD2Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_PLY_IMPORTER)
    out.push_back( new PLYImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MDL_IMPORTER)
    out.push_back( new MDLImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_ASE_IMPORTER)
  #if (!defined ASSIMP_BUILD_NO_3DS_IMPORTER)
    out.push_back( new ASEImporter());
#  endif
#endif
#if (!defined ASSIMP_BUILD_NO_HMP_IMPORTER)
    out.push_back( new HMPImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_SMD_IMPORTER)
    out.push_back( new SMDImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MDC_IMPORTER)
    out.push_back( new MDCImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_MD5_IMPORTER)
    out.push_back( new MD5Importer());
#endif
#if (!defined ASSIMP_BUILD_NO_STL_IMPORTER)
    out.push_back( new STLImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_LWO_IMPORTER)
    out.push_back( new LWOImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_DXF_IMPORTER)
    out.push_back( new DXFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_NFF_IMPORTER)
    out.push_back( new NFFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_RAW_IMPORTER)
    out.push_back( new RAWImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_SIB_IMPORTER)
    out.push_back( new SIBImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OFF_IMPORTER)
    out.push_back( new OFFImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_AC_IMPORTER)
    out.push_back( new AC3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_BVH_IMPORTER)
    out.push_back( new BVHLoader());
#endif
#if (!defined ASSIMP_BUILD_NO_IRRMESH_IMPORTER)
    out.push_back( new IRRMeshImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_IRR_IMPORTER)
    out.push_back( new IRRImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_Q3D_IMPORTER)
    out.push_back( new Q3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_B3D_IMPORTER)
    out.push_back( new B3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_COLLADA_IMPORTER)
    out.push_back( new ColladaLoader());
#endif
#if (!defined ASSIMP_BUILD_NO_TERRAGEN_IMPORTER)
    out.push_back( new TerragenImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_CSM_IMPORTER)
    out.push_back( new CSMImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_3D_IMPORTER)
    out.push_back( new UnrealImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_LWS_IMPORTER)
    out.push_back( new LWSImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OGRE_IMPORTER)
    out.push_back( new Ogre::OgreImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_OPENGEX_IMPORTER )
    out.push_back( new OpenGEX::OpenGEXImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_MS3D_IMPORTER)
    out.push_back( new MS3DImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_COB_IMPORTER)
    out.push_back( new COBImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_BLEND_IMPORTER)
    out.push_back( new BlenderImporter());
#endif
#if (!defined ASSIMP_BUILD_NO_Q3BSP_IMPORTER)
    out.push_back( new Q3BSPFileImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_NDO_IMPORTER)
    out.push_back( new NDOImporter() );
#endif
#if (!defined ASSIMP_BUILD_NO_IFC_IMPORTER)
    out.push_back( new IFCImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_XGL_IMPORTER )
    out.push_back( new XGLImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_FBX_IMPORTER )
    out.push_back( new FBXImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_ASSBIN_IMPORTER )
    out.push_back( new AssbinImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_GLTF_IMPORTER )
    out.push_back( new glTFImporter() );
    out.push_back( new glTF2Importer() );
#endif
#if ( !defined ASSIMP_BUILD_NO_C4D_IMPORTER )
    out.push_back( new C4DImporter() );
#endif
#if ( !defined ASSIMP_BUILD_NO_3MF_IMPORTER )
    out.push_back( new D3MFImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_X3D_IMPORTER
    out.push_back( new X3DImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_MMD_IMPORTER
    out.push_back( new MMDImporter() );
#endif
#ifndef ASSIMP_BUILD_NO_STEP_IMPORTER
    out.push_back(new StepFile::StepFileImporter());
#endif
}